

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nn.h
# Opt level: O2

vector<yyml::nn::Variable<double>_*,_std::allocator<yyml::nn::Variable<double>_*>_> * __thiscall
yyml::nn::NN::Parameters
          (vector<yyml::nn::Variable<double>_*,_std::allocator<yyml::nn::Variable<double>_*>_>
           *__return_storage_ptr__,NN *this)

{
  __node_base *p_Var1;
  vector<yyml::nn::Variable<double>_*,_std::allocator<yyml::nn::Variable<double>_*>_> layer_params;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yyml::nn::LayerInterface_*>
  name_and_layer_pair;
  _Vector_base<yyml::nn::Variable<double>_*,_std::allocator<yyml::nn::Variable<double>_*>_> local_60
  ;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yyml::nn::LayerInterface_*>
  local_48;
  
  (__return_storage_ptr__->
  super__Vector_base<yyml::nn::Variable<double>_*,_std::allocator<yyml::nn::Variable<double>_*>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<yyml::nn::Variable<double>_*,_std::allocator<yyml::nn::Variable<double>_*>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<yyml::nn::Variable<double>_*,_std::allocator<yyml::nn::Variable<double>_*>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  p_Var1 = &(this->layers_)._M_h._M_before_begin;
  while (p_Var1 = p_Var1->_M_nxt, p_Var1 != (__node_base *)0x0) {
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yyml::nn::LayerInterface_*>
    ::pair(&local_48,
           (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yyml::nn::LayerInterface_*>
            *)(p_Var1 + 1));
    (*(local_48.second)->_vptr_LayerInterface[1])(&local_60);
    std::vector<yyml::nn::Variable<double>*,std::allocator<yyml::nn::Variable<double>*>>::
    insert<__gnu_cxx::__normal_iterator<yyml::nn::Variable<double>**,std::vector<yyml::nn::Variable<double>*,std::allocator<yyml::nn::Variable<double>*>>>,void>
              ((vector<yyml::nn::Variable<double>*,std::allocator<yyml::nn::Variable<double>*>> *)
               __return_storage_ptr__,
               (const_iterator)
               (__return_storage_ptr__->
               super__Vector_base<yyml::nn::Variable<double>_*,_std::allocator<yyml::nn::Variable<double>_*>_>
               )._M_impl.super__Vector_impl_data._M_finish,
               (__normal_iterator<yyml::nn::Variable<double>_**,_std::vector<yyml::nn::Variable<double>_*,_std::allocator<yyml::nn::Variable<double>_*>_>_>
                )local_60._M_impl.super__Vector_impl_data._M_start,
               (__normal_iterator<yyml::nn::Variable<double>_**,_std::vector<yyml::nn::Variable<double>_*,_std::allocator<yyml::nn::Variable<double>_*>_>_>
                )local_60._M_impl.super__Vector_impl_data._M_finish);
    std::_Vector_base<yyml::nn::Variable<double>_*,_std::allocator<yyml::nn::Variable<double>_*>_>::
    ~_Vector_base(&local_60);
    std::__cxx11::string::~string((string *)&local_48);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Variable<double>*> Parameters() {
    std::vector<Variable<double>*> parameters;
    for (auto name_and_layer_pair : layers_) {
      auto* layer = name_and_layer_pair.second;
      auto layer_params = layer->Parameters();
      parameters.insert(parameters.end(), layer_params.begin(),
                        layer_params.end());
    }
    return parameters;
  }